

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

int archive_utility_string_sort_helper(char **strings,uint n)

{
  char *__s2;
  int iVar1;
  char **ppcVar2;
  int local_54;
  int retval2;
  int retval1;
  char *pivot;
  char **tmp;
  char **greater;
  char **lesser;
  uint greater_count;
  uint lesser_count;
  uint i;
  uint n_local;
  char **strings_local;
  
  if (n < 2) {
    strings_local._4_4_ = 0;
  }
  else {
    lesser._0_4_ = 0;
    lesser._4_4_ = 0;
    tmp = (char **)0x0;
    greater = (char **)0x0;
    __s2 = *strings;
    for (greater_count = 1; greater_count < n; greater_count = greater_count + 1) {
      iVar1 = strcmp(strings[greater_count],__s2);
      if (iVar1 < 0) {
        ppcVar2 = (char **)realloc(greater,(ulong)(lesser._4_4_ + 1) << 3);
        if (ppcVar2 == (char **)0x0) {
          free(tmp);
          free(greater);
          return -0x1e;
        }
        ppcVar2[lesser._4_4_] = strings[greater_count];
        greater = ppcVar2;
        lesser._4_4_ = lesser._4_4_ + 1;
      }
      else {
        ppcVar2 = (char **)realloc(tmp,(ulong)((uint)lesser + 1) << 3);
        if (ppcVar2 == (char **)0x0) {
          free(tmp);
          free(greater);
          return -0x1e;
        }
        ppcVar2[(uint)lesser] = strings[greater_count];
        tmp = ppcVar2;
        lesser._0_4_ = (uint)lesser + 1;
      }
    }
    iVar1 = archive_utility_string_sort_helper(greater,lesser._4_4_);
    for (greater_count = 0; greater_count < lesser._4_4_; greater_count = greater_count + 1) {
      strings[greater_count] = greater[greater_count];
    }
    free(greater);
    strings[lesser._4_4_] = __s2;
    local_54 = archive_utility_string_sort_helper(tmp,(uint)lesser);
    for (greater_count = 0; greater_count < (uint)lesser; greater_count = greater_count + 1) {
      strings[lesser._4_4_ + 1 + greater_count] = tmp[greater_count];
    }
    free(tmp);
    if (iVar1 < local_54) {
      local_54 = iVar1;
    }
    strings_local._4_4_ = local_54;
  }
  return strings_local._4_4_;
}

Assistant:

static int
archive_utility_string_sort_helper(char **strings, unsigned int n)
{
	unsigned int i, lesser_count, greater_count;
	char **lesser, **greater, **tmp, *pivot;
	int retval1, retval2;

	/* A list of 0 or 1 elements is already sorted */
	if (n <= 1)
		return (ARCHIVE_OK);

	lesser_count = greater_count = 0;
	lesser = greater = NULL;
	pivot = strings[0];
	for (i = 1; i < n; i++)
	{
		if (strcmp(strings[i], pivot) < 0)
		{
			lesser_count++;
			tmp = (char **)realloc(lesser,
				lesser_count * sizeof(char *));
			if (!tmp) {
				free(greater);
				free(lesser);
				return (ARCHIVE_FATAL);
			}
			lesser = tmp;
			lesser[lesser_count - 1] = strings[i];
		}
		else
		{
			greater_count++;
			tmp = (char **)realloc(greater,
				greater_count * sizeof(char *));
			if (!tmp) {
				free(greater);
				free(lesser);
				return (ARCHIVE_FATAL);
			}
			greater = tmp;
			greater[greater_count - 1] = strings[i];
		}
	}

	/* quicksort(lesser) */
	retval1 = archive_utility_string_sort_helper(lesser, lesser_count);
	for (i = 0; i < lesser_count; i++)
		strings[i] = lesser[i];
	free(lesser);

	/* pivot */
	strings[lesser_count] = pivot;

	/* quicksort(greater) */
	retval2 = archive_utility_string_sort_helper(greater, greater_count);
	for (i = 0; i < greater_count; i++)
		strings[lesser_count + 1 + i] = greater[i];
	free(greater);

	return (retval1 < retval2) ? retval1 : retval2;
}